

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestPackColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  Col *pCVar1;
  fpclass_type *pfVar2;
  fpclass_type *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pnVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  Dring *pDVar12;
  long lVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  fpclass_type *pfVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  fpclass_type *pfVar19;
  int *piVar20;
  
  pCVar1 = &(this->u).col;
  pDVar12 = (this->u).col.list.next;
  piVar20 = (this->u).col.max;
  if ((Col *)pDVar12 == pCVar1) {
    uVar16 = 0;
  }
  else {
    pnVar7 = (this->u).col.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar8 = (this->u).col.idx;
    piVar9 = (this->u).col.len;
    piVar10 = (this->u).col.start;
    uVar18 = 0;
    do {
      iVar4 = pDVar12->idx;
      if (piVar10[iVar4] != (int)uVar18) {
        do {
          iVar4 = pDVar12->idx;
          iVar5 = piVar10[iVar4];
          iVar17 = (int)uVar18;
          piVar10[iVar4] = iVar17;
          iVar6 = piVar9[iVar4];
          piVar20[iVar4] = iVar6;
          if (0 < iVar6) {
            lVar13 = (long)iVar5;
            uVar18 = (long)iVar17;
            pfVar19 = &(pnVar7->m_backend).fpclass;
            do {
              pfVar2 = pfVar19 + (long)iVar5 * 0x20;
              pfVar3 = pfVar19 + (long)iVar17 * 0x20 + -0x1e;
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)(pfVar2 + -0x1e);
              pfVar15 = pfVar3;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                *pfVar15 = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((pcVar14->data)._M_elems + 1);
                pfVar15 = pfVar15 + 1;
              }
              pfVar3[0x1c] = pfVar2[-2];
              *(bool *)(pfVar3 + 0x1d) = *(bool *)(pfVar2 + -1);
              *(undefined8 *)(pfVar3 + 0x1e) = *(undefined8 *)pfVar2;
              piVar8[uVar18] = piVar8[lVar13];
              uVar18 = uVar18 + 1;
              lVar13 = lVar13 + 1;
              pfVar19 = pfVar19 + 0x20;
            } while (lVar13 < iVar6 + iVar5);
          }
          uVar16 = (uint)uVar18;
          pDVar12 = pDVar12->next;
        } while ((Col *)pDVar12 != pCVar1);
        piVar20 = (this->u).col.max;
        break;
      }
      iVar5 = piVar9[iVar4];
      uVar16 = (int)uVar18 + iVar5;
      uVar18 = (ulong)uVar16;
      piVar20[iVar4] = iVar5;
      pDVar12 = pDVar12->next;
    } while ((Col *)pDVar12 != pCVar1);
  }
  (this->u).col.used = uVar16;
  piVar20[this->thedim] = 0;
  return;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}